

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O0

void __thiscall
datarate_test::(anonymous_namespace)::DatarateTestSVC_BasicRateTargeting444SVC3TL3SL_Test::
~DatarateTestSVC_BasicRateTargeting444SVC3TL3SL_Test
          (DatarateTestSVC_BasicRateTargeting444SVC3TL3SL_Test *this)

{
  DatarateTestSVC_BasicRateTargeting444SVC3TL3SL_Test *unaff_retaddr;
  
  anon_unknown_0::DatarateTestSVC_BasicRateTargeting444SVC3TL3SL_Test::
  ~DatarateTestSVC_BasicRateTargeting444SVC3TL3SL_Test(unaff_retaddr);
  return;
}

Assistant:

TEST_P(DatarateTestSVC, BasicRateTargeting444SVC3TL3SL) {
#endif
  BasicRateTargeting444SVC3TL3SLTest();
}